

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

Sto_Man_t * Sto_ManLoadClauses(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  Sto_Man_t *p;
  lit *pBeg;
  char *pcVar2;
  Sto_Cls_t *pSVar3;
  int iVar4;
  uint uVar5;
  int Number;
  int *local_448;
  int *local_440;
  char pBuffer [1024];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    p = (Sto_Man_t *)0x0;
    printf("Error: Cannot open input file (%s).\n",pFileName);
  }
  else {
    p = Sto_ManAlloc();
    pBeg = (lit *)malloc(0x1000);
    local_448 = &p->nClausesA;
    local_440 = &p->nClauses;
    p->nVars = 0;
    p->nRoots = 0;
    p->nClauses = 0;
    p->nClausesA = 0;
    while( true ) {
      pcVar2 = fgets(pBuffer,0x400,__stream);
      if (pcVar2 == (char *)0x0) break;
      if (pBuffer[0] != 'c') {
        if (pBuffer[0] == 'p') {
          __isoc99_sscanf(pBuffer + 1,"%d %d %d %d",p,local_440,&p->nRoots,local_448);
          break;
        }
        printf("Warning: Skipping line: \"%s\"\n",pBuffer);
      }
    }
    local_448._0_4_ = 0x400;
    iVar4 = 0;
    while( true ) {
      iVar1 = Sto_ManLoadNumber((FILE *)__stream,&Number);
      uVar5 = Number;
      if (iVar1 == 0) break;
      if (Number == 0) {
        iVar1 = Sto_ManAddClause(p,pBeg,pBeg + iVar4);
        iVar4 = 0;
        if (iVar1 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satStore.c"
                        ,0x1ae,"Sto_Man_t *Sto_ManLoadClauses(char *)");
        }
      }
      else {
        if (iVar4 == (int)local_448) {
          local_448._0_4_ = (int)local_448 * 2;
          if (pBeg == (lit *)0x0) {
            pBeg = (lit *)malloc((long)(int)local_448 << 2);
          }
          else {
            pBeg = (lit *)realloc(pBeg,(long)(int)local_448 << 2);
            uVar5 = Number;
          }
        }
        if ((int)uVar5 < 1) {
          iVar1 = ~uVar5 * 2 + 1;
        }
        else {
          iVar1 = uVar5 * 2 + -2;
        }
        pBeg[iVar4] = iVar1;
        iVar4 = iVar4 + 1;
      }
    }
    if (0 < iVar4) {
      puts("Error: The last clause was not saved.");
    }
    pSVar3 = (Sto_Cls_t *)&p->pHead;
    iVar4 = -1;
    do {
      pSVar3 = pSVar3->pNext;
      iVar4 = iVar4 + 1;
    } while (pSVar3 != (Sto_Cls_t *)0x0);
    if (*local_440 == iVar4) {
      free(pBeg);
      fclose(__stream);
    }
    else {
      printf("Error: The actual number of clauses (%d) is different than declared (%d).\n");
      Sto_ManFree(p);
      p = (Sto_Man_t *)0x0;
    }
  }
  return p;
}

Assistant:

Sto_Man_t * Sto_ManLoadClauses( char * pFileName )
{
    FILE * pFile;
    Sto_Man_t * p;
    Sto_Cls_t * pClause;
    char pBuffer[1024];
    int nLits, nLitsAlloc, Counter, Number;
    lit * pLits;

    // start the file
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Error: Cannot open input file (%s).\n", pFileName );
        return NULL;
    }

    // create the manager
    p = Sto_ManAlloc();

    // alloc the array of literals
    nLitsAlloc = 1024;
    pLits = (lit *)ABC_ALLOC( char, sizeof(lit) * nLitsAlloc );

    // read file header
    p->nVars = p->nClauses = p->nRoots = p->nClausesA = 0;
    while ( fgets( pBuffer, 1024, pFile ) )
    {
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            sscanf( pBuffer + 1, "%d %d %d %d", &p->nVars, &p->nClauses, &p->nRoots, &p->nClausesA );
            break;
        }
        printf( "Warning: Skipping line: \"%s\"\n", pBuffer );
    }

    // read the clauses
    nLits = 0;
    while ( Sto_ManLoadNumber(pFile, &Number) )
    {
        if ( Number == 0 )
        {
            int RetValue;
            RetValue = Sto_ManAddClause( p, pLits, pLits + nLits );
            assert( RetValue );
            nLits = 0;
            continue;
        }
        if ( nLits == nLitsAlloc )
        {
            nLitsAlloc *= 2;
            pLits = ABC_REALLOC( lit, pLits, nLitsAlloc );
        }
        pLits[ nLits++ ] = lit_read(Number);
    }
    if ( nLits > 0 )
        printf( "Error: The last clause was not saved.\n" );

    // count clauses
    Counter = 0;
    Sto_ManForEachClause( p, pClause )
        Counter++;

    // check the number of clauses
    if ( p->nClauses != Counter )
    {
        printf( "Error: The actual number of clauses (%d) is different than declared (%d).\n", Counter, p->nClauses );
        Sto_ManFree( p );
        return NULL;
    }

    ABC_FREE( pLits );
    fclose( pFile );
    return p;
}